

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piece_picker.cpp
# Opt level: O1

int __thiscall libtorrent::aux::piece_picker::remove(piece_picker *this,char *__filename)

{
  pointer *ppsVar1;
  int iVar2;
  pointer psVar3;
  pointer ppVar4;
  pointer psVar5;
  pointer psVar6;
  pointer psVar7;
  prio_index_t in_EDX;
  int iVar8;
  bool bVar9;
  
  psVar3 = (this->m_priority_boundaries).
           super_vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::prio_index_tag_t,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::prio_index_tag_t,_void>_>_>
           .
           super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::prio_index_tag_t,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::prio_index_tag_t,_void>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar4 = (this->m_piece_map).
           super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
           .
           super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar5 = (this->m_pieces).
           super_vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
           .
           super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar6 = (this->m_priority_boundaries).
           super_vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::prio_index_tag_t,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::prio_index_tag_t,_void>_>_>
           .
           super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::prio_index_tag_t,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::prio_index_tag_t,_void>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    psVar7 = (this->m_priority_boundaries).
             super_vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::prio_index_tag_t,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::prio_index_tag_t,_void>_>_>
             .
             super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::prio_index_tag_t,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::prio_index_tag_t,_void>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    __filename = (char *)(long)(int)__filename;
    do {
      iVar2 = psVar3[(long)__filename].m_val;
      iVar8 = iVar2 + -1;
      psVar3[(long)__filename].m_val = iVar8;
      if (in_EDX.m_val != iVar8) {
        __filename = (char *)(ulong)((int)__filename + 1);
        goto LAB_002908f3;
      }
      __filename = __filename + 1;
    } while ((long)__filename < (long)(int)((ulong)((long)psVar7 - (long)psVar3) >> 2));
    if (in_EDX.m_val == iVar8) {
      bVar9 = false;
    }
    else {
LAB_002908f3:
      iVar2 = psVar5[(long)iVar2 + -1].m_val;
      psVar5[in_EDX.m_val].m_val = iVar2;
      ((prio_index_t *)((long)(ppVar4 + iVar2) + 4))->m_val = in_EDX.m_val;
      bVar9 = (int)__filename != (int)((ulong)((long)psVar6 - (long)psVar3) >> 2);
      in_EDX.m_val = iVar8;
    }
    if (!bVar9) {
      ppsVar1 = &(this->m_pieces).
                 super_vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                 .
                 super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppsVar1 = *ppsVar1 + -1;
      return (int)psVar3;
    }
  } while( true );
}

Assistant:

void piece_picker::remove(int priority, prio_index_t elem_index)
	{
		TORRENT_ASSERT(!m_dirty);
		TORRENT_ASSERT(priority >= 0);

#ifdef TORRENT_PICKER_LOG
		std::cerr << "[" << this << "] " << "remove " << m_pieces[elem_index] << " (" << priority << ")" << std::endl;
#endif
		prio_index_t next_index = elem_index;
		TORRENT_ASSERT(m_piece_map[m_pieces[elem_index]].priority(this) == -1);
		for (;;)
		{
#ifdef TORRENT_PICKER_LOG
			print_pieces(*this);
#endif
			TORRENT_ASSERT(elem_index < m_pieces.end_index());
			prio_index_t temp{};
			do
			{
				temp = --m_priority_boundaries[priority];
				++priority;
			} while (next_index == temp && priority < int(m_priority_boundaries.size()));
			if (next_index == temp) break;
			next_index = temp;

			piece_index_t const piece = m_pieces[next_index];
			m_pieces[elem_index] = piece;
			m_piece_map[piece].index = elem_index;
			TORRENT_ASSERT(m_piece_map[piece].priority(this) == priority - 1);
			TORRENT_ASSERT(elem_index < prev(m_pieces.end_index()));
			elem_index = next_index;

			if (priority == int(m_priority_boundaries.size()))
				break;
		}
		m_pieces.pop_back();
		TORRENT_ASSERT(next_index == m_pieces.end_index());
#ifdef TORRENT_PICKER_LOG
		print_pieces(*this);
#endif
	}